

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O3

void av1_quantize_dc_facade
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,MACROBLOCK_PLANE *p,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,uint16_t *eob_ptr,SCAN_ORDER *sc,QUANT_PARAM *qparam)

{
  short sVar1;
  short sVar2;
  byte *pbVar3;
  byte *pbVar4;
  short *psVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  size_t __n;
  
  pbVar3 = qparam->qmatrix;
  pbVar4 = qparam->iqmatrix;
  psVar5 = p->round_QTX;
  sVar1 = *p->quant_fp_QTX;
  sVar2 = *p->dequant_QTX;
  iVar12 = qparam->log_scale;
  uVar7 = *coeff_ptr;
  __n = (long)(int)n_coeffs << 2;
  memset(qcoeff_ptr,0,__n);
  memset(dqcoeff_ptr,0,__n);
  if (pbVar3 == (byte *)0x0) {
    uVar8 = 0x20;
  }
  else {
    uVar8 = (ulong)*pbVar3;
  }
  if (pbVar4 == (byte *)0x0) {
    uVar11 = 0x20;
  }
  else {
    uVar11 = (uint)*pbVar4;
  }
  uVar6 = (int)uVar7 >> 0x1f;
  bVar9 = (byte)iVar12;
  iVar12 = (((1 << (bVar9 & 0x1f)) >> 1) + (int)*psVar5 >> (bVar9 & 0x1f)) +
           ((uVar7 ^ uVar6) - uVar6);
  if (0x7ffe < iVar12) {
    iVar12 = 0x7fff;
  }
  iVar10 = -0x8000;
  if (-0x8000 < iVar12) {
    iVar10 = iVar12;
  }
  uVar7 = (uint)((long)(uVar8 * (long)sVar1 * (long)iVar10) >> (0x15 - bVar9 & 0x3f));
  *qcoeff_ptr = (uVar6 ^ uVar7) - uVar6;
  *dqcoeff_ptr = ((int)(((int)(uVar11 * (int)sVar2 + 0x10) >> 5) * uVar7) >> (bVar9 & 0x1f) ^ uVar6)
                 - uVar6;
  *eob_ptr = (ushort)(uVar7 != 0);
  return;
}

Assistant:

void av1_quantize_dc_facade(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                            const MACROBLOCK_PLANE *p, tran_low_t *qcoeff_ptr,
                            tran_low_t *dqcoeff_ptr, uint16_t *eob_ptr,
                            const SCAN_ORDER *sc, const QUANT_PARAM *qparam) {
  // obsolete skip_block
  const int skip_block = 0;
  (void)sc;
  assert(qparam->log_scale >= 0 && qparam->log_scale < (3));
  const qm_val_t *qm_ptr = qparam->qmatrix;
  const qm_val_t *iqm_ptr = qparam->iqmatrix;
  quantize_dc(coeff_ptr, (int)n_coeffs, skip_block, p->round_QTX,
              p->quant_fp_QTX[0], qcoeff_ptr, dqcoeff_ptr, p->dequant_QTX[0],
              eob_ptr, qm_ptr, iqm_ptr, qparam->log_scale);
}